

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loclists.c
# Opt level: O1

int counted_loc_descr(Dwarf_Debug dbg,Dwarf_Small *data,Dwarf_Small *enddata,Dwarf_Unsigned offset,
                     Dwarf_Unsigned *loc_ops_overall_size,Dwarf_Unsigned *loc_ops_count_len,
                     Dwarf_Unsigned *loc_ops_len,Dwarf_Small **opsdata,Dwarf_Unsigned *opsoffset,
                     Dwarf_Error *error)

{
  int iVar1;
  Dwarf_Unsigned local_40;
  Dwarf_Unsigned local_38;
  
  local_38 = 0;
  local_40 = 0;
  iVar1 = dwarf_decode_leb128((char *)data,&local_38,&local_40,(char *)enddata);
  if (iVar1 == 1) {
    _dwarf_error_string(dbg,error,0x149,
                        "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
    local_40 = 0;
    local_38 = 0;
  }
  else {
    data = data + local_38;
  }
  if (iVar1 != 1) {
    *loc_ops_count_len = local_38;
    *loc_ops_overall_size = local_38 + local_40;
    *loc_ops_len = local_40;
    *opsdata = data;
    *opsoffset = offset + local_38;
  }
  return (uint)(iVar1 == 1);
}

Assistant:

static int
counted_loc_descr(Dwarf_Debug dbg,
    Dwarf_Small *data,
    Dwarf_Small *enddata,
    Dwarf_Unsigned offset,
    Dwarf_Unsigned *loc_ops_overall_size,
    Dwarf_Unsigned *loc_ops_count_len,
    Dwarf_Unsigned *loc_ops_len,
    Dwarf_Small    **opsdata,
    Dwarf_Unsigned *opsoffset,
    Dwarf_Error *  error)
{
    Dwarf_Unsigned ops_len = 0;
    Dwarf_Unsigned leblen = 0;
    DECODE_LEB128_UWORD_LEN_CK(data,ops_len,leblen,
        dbg,error,enddata);
    *loc_ops_count_len = leblen;
    *loc_ops_overall_size = ops_len+leblen;
    *loc_ops_len = ops_len;
    *opsdata = data;
    *opsoffset = offset +leblen;
    return DW_DLV_OK;
}